

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

void stbir__simple_alpha_weight_2ch(float *decode_buffer,int width_times_channels)

{
  float *pfVar1;
  float *decode;
  float *pfVar2;
  float *pfVar3;
  
  pfVar1 = decode_buffer + width_times_channels;
  pfVar2 = decode_buffer;
  if (7 < width_times_channels) {
    do {
      decode_buffer = pfVar2 + 8;
      *pfVar2 = pfVar2[1] * *pfVar2;
      pfVar2[1] = pfVar2[1] * 1.0;
      pfVar2[2] = pfVar2[3] * pfVar2[2];
      pfVar2[3] = pfVar2[3] * 1.0;
      pfVar2[4] = pfVar2[5] * pfVar2[4];
      pfVar2[5] = pfVar2[5] * 1.0;
      pfVar2[6] = pfVar2[7] * pfVar2[6];
      pfVar2[7] = pfVar2[7] * 1.0;
      pfVar3 = pfVar2 + 0x10;
      pfVar2 = decode_buffer;
    } while (pfVar3 <= pfVar1);
  }
  for (; decode_buffer < pfVar1; decode_buffer = decode_buffer + 2) {
    *decode_buffer = decode_buffer[1] * *decode_buffer;
  }
  return;
}

Assistant:

static void stbir__simple_alpha_weight_2ch( float * decode_buffer, int width_times_channels )
{
  float STBIR_STREAMOUT_PTR(*) decode = decode_buffer;
  float const * end_decode = decode_buffer + width_times_channels;

  #ifdef STBIR_SIMD
  decode += 2 * stbir__simdfX_float_count;
  STBIR_NO_UNROLL_LOOP_START
  while ( decode <= end_decode )
  {
    stbir__simdfX d0,a0,d1,a1;
    STBIR_NO_UNROLL(decode);
    stbir__simdfX_load( d0, decode-2*stbir__simdfX_float_count );
    stbir__simdfX_load( d1, decode-2*stbir__simdfX_float_count+stbir__simdfX_float_count );
    stbir__simdfX_a1a1( a0, d0, STBIR_onesX );
    stbir__simdfX_a1a1( a1, d1, STBIR_onesX );
    stbir__simdfX_mult( d0, d0, a0 );
    stbir__simdfX_mult( d1, d1, a1 );
    stbir__simdfX_store ( decode-2*stbir__simdfX_float_count, d0 );
    stbir__simdfX_store ( decode-2*stbir__simdfX_float_count+stbir__simdfX_float_count, d1 );
    decode += 2 * stbir__simdfX_float_count;
  }
  decode -= 2 * stbir__simdfX_float_count;
  #endif

  STBIR_SIMD_NO_UNROLL_LOOP_START
  while( decode < end_decode )
  {
    float alpha = decode[1];
    STBIR_SIMD_NO_UNROLL(decode);
    decode[0] *= alpha;
    decode += 2;
  }
}